

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedundantSetElimination.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_21::RedundantSetElimination::doWalkFunction
          (RedundantSetElimination *this,Function *func)

{
  CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
  *this_00;
  _Elt_pointer ppBVar1;
  ValueNumbering *this_01;
  __node_base_ptr p_Var2;
  char cVar3;
  Id IVar4;
  Index IVar5;
  pointer puVar6;
  pointer puVar7;
  __buckets_ptr pp_Var8;
  pointer puVar9;
  pointer ppBVar10;
  long *plVar11;
  _Hash_node_base *p_Var12;
  __buckets_ptr pp_Var13;
  __node_base_ptr p_Var14;
  Module *pMVar15;
  BasicBlock *pBVar16;
  undefined8 *puVar17;
  LocalSet *this_02;
  pointer pppEVar18;
  void *pvVar19;
  undefined8 *puVar20;
  undefined1 __s1 [8];
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_03;
  Index IVar21;
  int iVar22;
  uint uVar23;
  size_t sVar24;
  BasicBlock *pBVar25;
  mapped_type *pmVar26;
  pointer __dest;
  __node_ptr p_Var27;
  long *plVar28;
  long *plVar29;
  long lVar30;
  BasicBlock *pBVar31;
  _Hash_node_base **__s;
  __node_base_ptr p_Var32;
  mapped_type *pmVar33;
  Expression **ppEVar34;
  BasicBlock *pBVar35;
  Type TVar36;
  SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  *pSVar37;
  key_type pBVar38;
  Type left;
  ulong uVar39;
  _Hash_node_base *p_Var40;
  _Rb_tree_node_base *p_Var41;
  Expression **currp;
  ValueNumbering *__c;
  ulong uVar42;
  size_type __n_00;
  ulong uVar43;
  _Map_pointer __n;
  _Elt_pointer ppBVar44;
  size_t __n_01;
  pointer ppBVar45;
  Expression *pEVar46;
  Function *__x;
  RedundantSetElimination *self_00;
  key_type *__n_02;
  long *plVar47;
  BasicBlock *pBVar48;
  pointer ppBVar49;
  __node_base_ptr p_Var50;
  key_type expr;
  __hash_code _Var51;
  pointer this_04;
  _Elt_pointer ppBVar52;
  _Map_pointer *this_05;
  Index IVar53;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_06;
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auStack_2a8 [8];
  UniqueDeferredQueue<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>
  work;
  pointer local_1a0;
  pointer local_190;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_178;
  undefined8 local_140;
  pointer local_138;
  RedundantSetElimination *local_130;
  undefined1 local_128 [8];
  vector<bool,_std::allocator<bool>_> isRefinable;
  undefined1 local_d8 [8];
  value_type oldValue;
  __buckets_ptr local_c8;
  _Rb_tree_const_iterator<unsigned_int> local_c0;
  long *local_b8;
  undefined1 local_b0 [8];
  LocalValues currValues;
  uint local_6c;
  __buckets_alloc_type __alloc;
  BasicBlock *pBStack_68;
  undefined1 local_60 [8];
  BasicBlock *item;
  pointer local_50;
  _Rb_tree_const_iterator<unsigned_int> local_48;
  BasicBlock *local_40;
  __hash_code __code;
  RedundantSetElimination *self;
  
  __x = func;
  sVar24 = Function::getNumLocals(func);
  this->numLocals = (Index)sVar24;
  if ((Index)sVar24 != 0) {
    IVar21 = (this->valueNumbering).nextValue;
    (this->valueNumbering).nextValue = IVar21 + 1;
    this->unseenValue = IVar21;
    this_00 = &(this->
               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
               ).
               super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
    ;
    puVar6 = (this->
             super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
             ).
             super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
             .basicBlocks.
             super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (this->
             super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
             ).
             super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
             .basicBlocks.
             super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_04 = puVar6;
    currValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)func;
    __code = (__hash_code)this;
    if (puVar7 != puVar6) {
      do {
        std::
        unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
        ::~unique_ptr(this_04);
        this_04 = this_04 + 1;
      } while (this_04 != puVar7);
      *(pointer *)(__code + 0x148) = puVar6;
    }
    _Var51 = __code;
    std::
    _Rb_tree<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_unsigned_long>_>_>
    ::_M_erase(*(_Rb_tree<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_unsigned_long>_>_>
                 **)(__code + 0x268),(_Link_type)__x);
    *(undefined8 *)(_Var51 + 0x268) = 0;
    *(__hash_code *)(_Var51 + 0x270) = _Var51 + 0x260;
    *(__hash_code *)(_Var51 + 0x278) = _Var51 + 0x260;
    *(undefined8 *)(_Var51 + 0x280) = 0;
    *(undefined8 *)(_Var51 + 0x138) = 0;
    *(undefined1 *)(_Var51 + 0x250) = 0;
    CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
    ::startBasicBlock(this_00);
    *(undefined8 *)(_Var51 + 0x130) = *(undefined8 *)(_Var51 + 0x170);
    self_00 = (RedundantSetElimination *)
              (currValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x18);
    local_130 = self_00;
    Walker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>_>
    ::walk((Walker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>_>
            *)this_00,(Expression **)self_00);
    if (*(long *)(_Var51 + 0x170) != 0) {
      CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
      ::doEndReturn((CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                     *)_Var51,self_00,currp);
    }
    if (*(char *)(_Var51 + 0x250) == '\x01') {
      auStack_2a8 = *(undefined1 (*) [8])(_Var51 + 0x138);
      std::
      vector<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
      ::push_back((vector<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
                   *)(_Var51 + 0x140),(value_type *)auStack_2a8);
      std::
      unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
      ::~unique_ptr((unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
                     *)auStack_2a8);
    }
    if (*(long *)(_Var51 + 0x1a0) != 0) {
      __assert_fail("branches.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x255,
                    "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                   );
    }
    if (*(long *)(_Var51 + 0x1b0) != *(long *)(_Var51 + 0x1a8)) {
      __assert_fail("ifLastBlockStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x256,
                    "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                   );
    }
    if (*(long *)(_Var51 + 0x1c8) != *(long *)(_Var51 + 0x1c0)) {
      __assert_fail("loopLastBlockStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,599,
                    "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                   );
    }
    if (*(long *)(_Var51 + 0x1e0) != *(long *)(_Var51 + 0x1d8)) {
      __assert_fail("tryLastBlockStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,600,
                    "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                   );
    }
    if (*(long *)(_Var51 + 0x1f8) != *(long *)(_Var51 + 0x1f0)) {
      __assert_fail("throwingInstsStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x259,
                    "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                   );
    }
    if (*(long *)(_Var51 + 0x210) != *(long *)(_Var51 + 0x208)) {
      __assert_fail("tryStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x25a,
                    "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                   );
    }
    if (*(long *)(_Var51 + 0x228) != *(long *)(_Var51 + 0x220)) {
      __assert_fail("processCatchStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x25b,
                    "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                   );
    }
    this_01 = (ValueNumbering *)(_Var51 + 0x298);
    pBVar25 = *(BasicBlock **)(_Var51 + 0x140);
    pBStack_68 = *(BasicBlock **)(_Var51 + 0x148);
    if (pBVar25 != pBStack_68) {
      do {
        local_40 = (BasicBlock *)
                   (pBVar25->contents).start.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                   (ulong)*(uint *)(_Var51 + 0x28c));
        if ((__buckets_ptr)
            (pBVar25->contents).start.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == *(__buckets_ptr *)(_Var51 + 0x130)) {
          if (*(int *)(_Var51 + 0x28c) != 0) {
            uVar39 = 0;
            do {
              puVar9 = currValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
              TVar36 = Function::getLocalType
                                 ((Function *)
                                  currValues.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(Index)uVar39);
              bVar54 = Function::isParam((Function *)puVar9,(Index)uVar39);
              if (bVar54) {
LAB_00a810c0:
                IVar21 = this_01->nextValue;
                this_01->nextValue = IVar21 + 1;
                *(Index *)((long)(local_40->contents).start.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar39 * 4) = IVar21;
              }
              else {
                auStack_2a8 = (undefined1  [8])TVar36;
                bVar54 = wasm::Type::isDefaultable((Type *)auStack_2a8);
                if (!bVar54) goto LAB_00a810c0;
                Literal::makeZeros((Literals *)local_128,TVar36);
                SmallVector<wasm::Literal,_1UL>::SmallVector
                          ((SmallVector<wasm::Literal,_1UL> *)auStack_2a8,
                           (SmallVector<wasm::Literal,_1UL> *)local_128);
                IVar21 = ValueNumbering::getValue(this_01,(Literals *)auStack_2a8);
                std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                          ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                           ((long)&work.data.c.
                                   super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                                   ._M_impl.super__Deque_impl_data._M_start + 8));
                Literal::~Literal((Literal *)&work);
                *(Index *)((long)(local_40->contents).start.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar39 * 4) = IVar21;
                std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                          ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                           &isRefinable.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
                Literal::~Literal((Literal *)&isRefinable);
              }
              uVar39 = uVar39 + 1;
            } while (uVar39 < *(uint *)(__code + 0x28c));
          }
        }
        else if (*(int *)(_Var51 + 0x28c) != 0) {
          pp_Var8 = (__buckets_ptr)
                    (local_40->contents).start.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar39 = 0;
          do {
            *(undefined4 *)((long)pp_Var8 + uVar39 * 4) = *(undefined4 *)(__code + 0x348);
            uVar39 = uVar39 + 1;
          } while (uVar39 < *(uint *)(__code + 0x28c));
        }
        _Var51 = __code;
        this_06 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ((long)(pBVar25->contents).start.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x18);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (this_06,(ulong)*(uint *)(__code + 0x28c));
        if (*(int *)(_Var51 + 0x28c) != 0) {
          puVar9 = (this_06->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar39 = 0;
          do {
            puVar9[uVar39] = *(uint *)(_Var51 + 0x348);
            uVar39 = uVar39 + 1;
          } while (uVar39 < *(uint *)(_Var51 + 0x28c));
        }
        pBVar25 = (BasicBlock *)
                  &(pBVar25->contents).start.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      } while (pBVar25 != pBStack_68);
    }
    auStack_2a8 = (undefined1  [8])0x0;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 0;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&DAT_00000008;
    auStack_2a8 = (undefined1  [8])operator_new(0x40);
    ppBVar44 = (_Elt_pointer)
               (((long)work.data.c.
                       super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                       ._M_impl.super__Deque_impl_data._M_map * 4 - 4U & 0xfffffffffffffff8) +
               (long)auStack_2a8);
    ppBVar52 = ppBVar44;
    do {
      pBVar25 = (BasicBlock *)operator_new(0x200);
      *ppBVar52 = pBVar25;
      bVar54 = ppBVar52 < ppBVar44;
      ppBVar52 = ppBVar52 + 1;
    } while (bVar54);
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node =
         (_Map_pointer)&work.count._M_h._M_rehash_policy._M_next_resize;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_map_size = (size_t)*ppBVar44;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first =
         (_Elt_pointer)
         &(((BasicBlock *)
           (work.data.c.
            super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
            ._M_impl.super__Deque_impl_data._M_map_size + 0x1e0))->contents).end.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish;
    work.count._M_h._M_buckets = (__buckets_ptr)0x1;
    work.count._M_h._M_bucket_count = 0;
    work.count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    work.count._M_h._M_element_count._0_4_ = 0x3f800000;
    work.count._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    work.count._M_h._M_rehash_policy._4_4_ = 0;
    work.count._M_h._M_rehash_policy._M_next_resize = 0;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur =
         (_Elt_pointer)
         work.data.c.
         super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
         ._M_impl.super__Deque_impl_data._M_map_size;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = ppBVar44;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node =
         (_Map_pointer)
         work.data.c.
         super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
         ._M_impl.super__Deque_impl_data._M_map_size;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur =
         (_Elt_pointer)
         work.data.c.
         super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
         ._M_impl.super__Deque_impl_data._M_map_size;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first =
         work.data.c.
         super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    work.data.c.
    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = ppBVar44;
    UniqueDeferredQueue<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>
    ::push((UniqueDeferredQueue<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>
            *)auStack_2a8,*(BasicBlock **)(_Var51 + 0x130));
    pBVar25 = (BasicBlock *)(_Var51 + 0x310);
    local_b8 = (long *)(_Var51 + 0x330);
    pp_Var8 = (__buckets_ptr)(_Var51 + 0x340);
    p_Var2 = (__node_base_ptr)(_Var51 + 800);
    while( true ) {
      this_05 = (_Map_pointer *)
                ((long)&work.data.c.
                        super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish + 0x18);
      puVar20 = (undefined8 *)work.count._M_h._M_bucket_count;
      if (((long)((long)work.data.c.
                        super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first -
                 work.data.c.
                 super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                 ._M_impl.super__Deque_impl_data._M_map_size) >> 3) +
          ((long)work.data.c.
                 super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node -
           (long)work.data.c.
                 super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 3) +
          ((((ulong)((long)work.data.c.
                           super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_last -
                    (long)work.data.c.
                          super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
          (ulong)(work.data.c.
                  super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x40 ==
          0) break;
      do {
        if (((long)((long)work.data.c.
                          super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_first -
                   work.data.c.
                   super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                   ._M_impl.super__Deque_impl_data._M_map_size) >> 3) +
            ((long)work.data.c.
                   super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node -
             (long)work.data.c.
                   super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 3) +
            ((((ulong)((long)work.data.c.
                             super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_last -
                      (long)work.data.c.
                            super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
            (ulong)(work.data.c.
                    super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x40
            == 0) {
          __assert_fail("!empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/unique_deferring_queue.h"
                        ,0x34,
                        "T wasm::UniqueDeferredQueue<wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::BasicBlock *>::pop() [T = wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::BasicBlock *]"
                       );
        }
        pBVar31 = *(BasicBlock **)
                   work.data.c.
                   super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                   ._M_impl.super__Deque_impl_data._M_map_size;
        local_60 = (undefined1  [8])pBVar31;
        pmVar26 = std::
                  unordered_map<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_unsigned_long,_std::hash<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_unsigned_long>_>_>
                  ::operator[]((unordered_map<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_unsigned_long,_std::hash<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_unsigned_long>_>_>
                                *)this_05,(key_type *)local_60);
        *pmVar26 = *pmVar26 - 1;
        __c = (ValueNumbering *)
              (work.data.c.
               super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first + -1);
        if ((ValueNumbering *)
            work.data.c.
            super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
            ._M_impl.super__Deque_impl_data._M_map_size == __c) {
          operator_delete(work.data.c.
                          super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur,0x200);
          work.data.c.
          super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
          ._M_impl.super__Deque_impl_data._M_map_size =
               (size_t)work.data.c.
                       super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last[1];
          __c = (ValueNumbering *)
                &(((BasicBlock *)
                  (work.data.c.
                   super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                   ._M_impl.super__Deque_impl_data._M_map_size + 0x1e0))->contents).end.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          work.data.c.
          super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur =
               (_Elt_pointer)
               work.data.c.
               super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
               ._M_impl.super__Deque_impl_data._M_map_size;
          work.data.c.
          super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
          ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)__c;
          work.data.c.
          super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
          ._M_impl.super__Deque_impl_data._M_start._M_last =
               work.data.c.
               super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last + 1;
        }
        else {
          work.data.c.
          super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
          ._M_impl.super__Deque_impl_data._M_map_size =
               work.data.c.
               super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
               ._M_impl.super__Deque_impl_data._M_map_size + 8;
        }
        __n_02 = (key_type *)local_60;
        pmVar26 = std::
                  unordered_map<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_unsigned_long,_std::hash<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_unsigned_long>_>_>
                  ::operator[]((unordered_map<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_unsigned_long,_std::hash<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_unsigned_long>_>_>
                                *)this_05,(key_type *)local_60);
      } while (*pmVar26 != 0);
      ppBVar45 = (pBVar31->in).
                 super__Vector_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppBVar10 = (pBVar31->in).
                 super__Vector_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_40 = pBVar31;
      if (ppBVar45 != ppBVar10) {
        uVar39 = (long)ppBVar10 - (long)ppBVar45;
        if (uVar39 == 8) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pBVar31,
                     &((*ppBVar45)->contents).end);
        }
        else {
          __dest = std::
                   allocator_traits<std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                   ::allocate((allocator_type *)((long)uVar39 >> 3),(size_type)__n_02);
          ppBVar45 = (pBVar31->in).
                     super__Vector_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          __n_01 = (long)(pBVar31->in).
                         super__Vector_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar45;
          if (__n_01 != 0) {
            memmove(__dest,ppBVar45,__n_01);
          }
          if (*(int *)(_Var51 + 0x28c) != 0) {
            local_138 = __dest + 1;
            pBVar48 = (BasicBlock *)0x0;
            do {
              iVar22 = *(int *)((long)(pBVar31->contents).start.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (long)pBVar48 * 4)
              ;
              pBStack_68 = pBVar48;
              local_60 = (undefined1  [8])pBVar31;
              p_Var27 = std::
                        _Hashtable<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>,_std::allocator<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::_M_find_node((_Hashtable<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>,_std::allocator<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                        *)pBVar25,(ulong)pBVar31 % *(ulong *)(_Var51 + 0x318),
                                       (key_type *)local_60,(__hash_code)__c);
              pBVar48 = pBStack_68;
              if (p_Var27 == (__node_ptr)0x0) {
LAB_00a814d2:
                IVar21 = ((*__dest)->contents).end.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)pBStack_68];
                ppBVar49 = local_138;
                do {
                  if (ppBVar49 == (pointer)(__n_01 + (long)__dest)) break;
                  IVar5 = ((*ppBVar49)->contents).end.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)pBVar48];
                  uVar23 = *(uint *)(__code + 0x348);
                  __c = (ValueNumbering *)(ulong)uVar23;
                  IVar53 = IVar5;
                  if (((IVar21 == uVar23) || (IVar53 = IVar21, IVar5 == uVar23)) ||
                     (IVar21 == IVar5)) {
                    ppBVar49 = ppBVar49 + 1;
                    bVar54 = true;
                    IVar21 = IVar53;
                  }
                  else {
                    local_b0._0_4_ = SUB84(pBVar48,0);
                    uVar42 = (ulong)pBVar31 % *(ulong *)(__code + 0x318);
                    local_d8 = (undefined1  [8])pBVar31;
                    pBVar31 = (BasicBlock *)
                              std::
                              _Hashtable<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>,_std::allocator<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              ::_M_find_node((_Hashtable<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>,_std::allocator<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                              *)pBVar25,uVar42,(key_type *)local_d8,__code);
                    if (pBVar31 == (BasicBlock *)0x0) {
                      local_60 = (undefined1  [8])pBVar25;
                      pBVar31 = (BasicBlock *)operator_new(0x48);
                      (pBVar31->contents).start.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      *(BasicBlock **)
                       ((long)&(pBVar31->contents).start.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 8) = local_40;
                      *(pointer *)
                       ((long)&(pBVar31->contents).start.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
                      (pBVar31->contents).end.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      (pBVar31->contents).items.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      *(pointer *)
                       ((long)&(pBVar31->contents).items.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
                      *(pointer *)
                       ((long)&(pBVar31->contents).items.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
                      *(pointer **)
                       ((long)&(pBVar31->contents).start.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 0x10) =
                           (pointer *)
                           ((long)&(pBVar31->contents).items.
                                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                   ._M_impl.super__Vector_impl_data + 0x10);
                      (pBVar31->contents).end.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x1;
                      *(pointer *)
                       ((long)&(pBVar31->contents).end.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
                      *(pointer *)
                       ((long)&(pBVar31->contents).end.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
                      *(undefined4 *)
                       &(pBVar31->contents).items.
                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                        ._M_impl.super__Vector_impl_data._M_start = 0x3f800000;
                      *(pointer *)
                       ((long)&(pBVar31->contents).items.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
                      *(pointer *)
                       ((long)&(pBVar31->contents).items.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
                      local_140 = *(undefined8 *)(__code + 0x338);
                      item = pBVar31;
                      auVar55 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                          ((ulong)local_b8,*(ulong *)(__code + 0x318),
                                           *(ulong *)(__code + 0x328));
                      __n_00 = auVar55._8_8_;
                      if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        if (__n_00 == 1) {
                          *pp_Var8 = (__node_base_ptr)0x0;
                          __s = pp_Var8;
                        }
                        else {
                          __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                          ((new_allocator<std::__detail::_Hash_node_base_*> *)
                                           &local_6c,__n_00,(void *)0x0);
                          memset(__s,0,__n_00 * 8);
                        }
                        _Var51 = __code;
                        p_Var40 = p_Var2->_M_nxt;
                        p_Var2->_M_nxt = (_Hash_node_base *)0x0;
                        if (p_Var40 != (_Hash_node_base *)0x0) {
                          uVar42 = 0;
                          do {
                            p_Var12 = p_Var40->_M_nxt;
                            uVar43 = (ulong)p_Var40[1]._M_nxt % __n_00;
                            if (__s[uVar43] == (__node_base_ptr)0x0) {
                              p_Var40->_M_nxt = p_Var2->_M_nxt;
                              p_Var2->_M_nxt = p_Var40;
                              __s[uVar43] = p_Var2;
                              if (p_Var40->_M_nxt != (_Hash_node_base *)0x0) {
                                p_Var32 = (__node_base_ptr)(__s + uVar42);
                                goto LAB_00a81681;
                              }
                            }
                            else {
                              p_Var40->_M_nxt = __s[uVar43]->_M_nxt;
                              p_Var32 = __s[uVar43];
                              uVar43 = uVar42;
LAB_00a81681:
                              p_Var32->_M_nxt = p_Var40;
                            }
                            p_Var40 = p_Var12;
                            uVar42 = uVar43;
                          } while (p_Var12 != (_Hash_node_base *)0x0);
                        }
                        pp_Var13 = (__buckets_ptr)
                                   (pBVar25->contents).start.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                        if (pp_Var8 != pp_Var13) {
                          operator_delete(pp_Var13,*(long *)(__code + 0x318) << 3);
                        }
                        *(size_type *)(_Var51 + 0x318) = __n_00;
                        *(_Hash_node_base ***)(_Var51 + 0x310) = __s;
                        uVar42 = (ulong)local_40 % __n_00;
                      }
                      pp_Var13 = (__buckets_ptr)
                                 (pBVar25->contents).start.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                      if (pp_Var13[uVar42] == (__node_base_ptr)0x0) {
                        p_Var40 = p_Var2->_M_nxt;
                        (pBVar31->contents).start.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)p_Var40;
                        p_Var2->_M_nxt = (_Hash_node_base *)pBVar31;
                        if (p_Var40 != (_Hash_node_base *)0x0) {
                          pp_Var13[(ulong)p_Var40[1]._M_nxt % *(ulong *)(__code + 0x318)] =
                               (__node_base_ptr)pBVar31;
                        }
                        *(__node_base_ptr *)
                         ((long)(pBVar25->contents).start.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar42 * 8) = p_Var2;
                      }
                      else {
                        (pBVar31->contents).start.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)pp_Var13[uVar42]->_M_nxt;
                        pp_Var13[uVar42]->_M_nxt = (_Hash_node_base *)pBVar31;
                      }
                      *(long *)(__code + 0x328) = *(long *)(__code + 0x328) + 1;
                      item = (BasicBlock *)0x0;
                      std::
                      _Hashtable<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>,_std::allocator<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_Scoped_node::~_Scoped_node((_Scoped_node *)local_60);
                    }
                    this_03 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)((long)&(pBVar31->contents).start.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data + 0x10);
                    __c = (ValueNumbering *)(ulong)(uint)local_b0._0_4_;
                    puVar9 = (pBVar31->contents).end.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    uVar42 = (ulong)__c % (ulong)puVar9;
                    plVar28 = *(long **)(*(long *)&this_03->field_0x0 + uVar42 * 8);
                    plVar29 = (long *)0x0;
                    if ((plVar28 != (long *)0x0) &&
                       (plVar29 = plVar28, plVar47 = (long *)*plVar28,
                       local_b0._0_4_ != *(uint *)((long *)*plVar28 + 1))) {
                      while (plVar28 = (long *)*plVar47, plVar28 != (long *)0x0) {
                        plVar29 = (long *)0x0;
                        if (((ulong)*(uint *)(plVar28 + 1) % (ulong)puVar9 != uVar42) ||
                           (plVar29 = plVar47, plVar47 = plVar28,
                           local_b0._0_4_ == *(uint *)(plVar28 + 1))) goto LAB_00a817a3;
                      }
                      plVar29 = (long *)0x0;
                    }
LAB_00a817a3:
                    if (plVar29 == (long *)0x0) {
                      lVar30 = 0;
                    }
                    else {
                      lVar30 = *plVar29;
                    }
                    if (lVar30 == 0) {
                      IVar21 = this_01->nextValue;
                      this_01->nextValue = IVar21 + 1;
                      __c = this_01;
                      pmVar33 = std::__detail::
                                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::operator[](this_03,(key_type *)local_b0);
                      *pmVar33 = IVar21;
                    }
                    else {
                      IVar21 = *(Index *)(lVar30 + 0xc);
                    }
                    bVar54 = false;
                    pBVar48 = pBStack_68;
                    pBVar31 = local_40;
                  }
                } while (bVar54);
                *(Index *)((long)(pBVar31->contents).start.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + (long)pBVar48 * 4) =
                     IVar21;
                _Var51 = __code;
              }
              else {
                uVar42 = *(ulong *)((long)&(p_Var27->
                                           super__Hash_node_value<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>,_false>
                                           ).
                                           super__Hash_node_value_base<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                                           ._M_storage._M_storage + 0x10);
                __c = (ValueNumbering *)((ulong)pBStack_68 % uVar42);
                plVar28 = *(long **)(*(long *)((long)&(p_Var27->
                                                                                                            
                                                  super__Hash_node_value<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                                                  ._M_storage._M_storage + 8) + (long)__c * 8);
                plVar29 = (long *)0x0;
                if (plVar28 != (long *)0x0) {
                  pBVar35 = (BasicBlock *)(ulong)*(uint *)((long *)*plVar28 + 1);
                  plVar47 = (long *)*plVar28;
                  do {
                    plVar29 = plVar28;
                    if (pBStack_68 == pBVar35) break;
                    plVar11 = (long *)*plVar47;
                    if (plVar11 == (long *)0x0) {
                      plVar29 = (long *)0x0;
                      break;
                    }
                    pBVar35 = (BasicBlock *)(ulong)*(uint *)(plVar11 + 1);
                    plVar29 = (long *)0x0;
                    plVar28 = plVar47;
                    plVar47 = plVar11;
                  } while ((ValueNumbering *)((ulong)pBVar35 % uVar42) == __c);
                }
                if (plVar29 == (long *)0x0) {
                  lVar30 = 0;
                }
                else {
                  lVar30 = *plVar29;
                }
                if ((lVar30 == 0) || (*(int *)(lVar30 + 0xc) != iVar22)) goto LAB_00a814d2;
              }
              pBVar48 = (BasicBlock *)
                        ((long)&(pBVar48->contents).start.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1);
            } while (pBVar48 < (BasicBlock *)(ulong)*(uint *)(_Var51 + 0x28c));
          }
          operator_delete(__dest,uVar39);
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pBVar31);
      p_Var14 = (__node_base_ptr)
                (pBVar31->contents).items.
                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      __s1 = local_60;
      pBVar48 = item;
      for (p_Var50 = (__node_base_ptr)
                     (pBVar31->contents).items.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_start; local_60 = __s1, item = pBVar48,
          p_Var50 != p_Var14; p_Var50 = p_Var50 + 1) {
        pBVar48 = (BasicBlock *)p_Var50->_M_nxt->_M_nxt;
        if (*(char *)&(pBVar48->contents).start.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start == '\t') {
          lVar30 = *(long *)(__code + 8);
          pMVar15 = *(Module **)(__code + 0x128);
          pBVar35 = (BasicBlock *)
                    (pBVar48->contents).end.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pBStack_68 = pBVar48;
          do {
            pBVar48 = pBVar35;
            local_d8 = (undefined1  [8])pBVar48;
            ppEVar34 = Properties::getImmediateFallthroughPtr
                                 ((Expression **)local_d8,(PassOptions *)(lVar30 + 0x30),pMVar15,
                                  AllowTeeBrIf);
            pBVar31 = local_40;
            pBVar35 = (BasicBlock *)*ppEVar34;
          } while (pBVar35 != pBVar48);
          cVar3 = *(char *)&(pBVar48->contents).start.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
          if (cVar3 == '\b') {
            pBVar35 = (BasicBlock *)
                      (ulong)*(uint *)((long)&(((Info *)local_60)->start).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                      (ulong)*(uint *)&((__node_base *)
                                                       &(pBVar48->contents).start.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_nxt * 4);
          }
          IVar21 = (Index)pBVar35;
          if (cVar3 != '\b') {
            IVar21 = ValueNumbering::getValue(this_01,(Expression *)pBVar48);
          }
          *(Index *)((long)&(((Info *)local_60)->start).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                    (ulong)*(uint *)&((__node_base *)
                                     &(pBStack_68->contents).start.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_nxt *
                    4) = IVar21;
        }
        __s1 = local_60;
        pBVar48 = item;
      }
      pBVar35 = (BasicBlock *)
                (pBVar31->contents).end.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar16 = *(BasicBlock **)
                 &(pBVar31->contents).end.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      if (((long)pBVar48 - (long)__s1 != (long)pBVar16 - (long)pBVar35) ||
         (((undefined1  [8])pBVar48 != __s1 &&
          (iVar22 = bcmp((void *)__s1,pBVar35,(long)pBVar48 - (long)__s1), iVar22 != 0)))) {
        if ((ulong)*(uint *)(__code + 0x28c) != 0) {
          uVar39 = 0;
          do {
            if (*(uint *)((long)&(((BasicBlock *)__s1)->contents).start.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar39 * 4) <
                *(uint *)((long)&(pBVar35->contents).start.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar39 * 4)) {
              __assert_fail("currValues[i] >= curr->contents.end[i]",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RedundantSetElimination.cpp"
                            ,0x149,
                            "void wasm::(anonymous namespace)::RedundantSetElimination::flowValues(Function *)"
                           );
            }
            uVar39 = uVar39 + 1;
          } while (*(uint *)(__code + 0x28c) != uVar39);
        }
        puVar9 = (pBVar31->contents).end.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (pBVar31->contents).end.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)__s1;
        *(BasicBlock **)
         &(pBVar31->contents).end.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = pBVar48;
        (pBVar31->contents).end.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = local_50;
        ppBVar10 = (pBVar31->out).
                   super__Vector_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        local_60 = (undefined1  [8])pBVar35;
        item = pBVar16;
        local_50 = puVar9;
        for (ppBVar45 = (pBVar31->out).
                        super__Vector_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppBVar45 != ppBVar10;
            ppBVar45 = ppBVar45 + 1) {
          UniqueDeferredQueue<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>
          ::push((UniqueDeferredQueue<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>
                  *)auStack_2a8,*ppBVar45);
        }
      }
      _Var51 = __code;
      if (local_60 != (undefined1  [8])0x0) {
        operator_delete((void *)local_60,(long)local_50 - (long)local_60);
        _Var51 = __code;
      }
    }
    while (puVar20 != (undefined8 *)0x0) {
      puVar17 = (undefined8 *)*puVar20;
      operator_delete(puVar20,0x18);
      puVar20 = puVar17;
    }
    memset(work.data.c.
           super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node,0,(long)work.count._M_h._M_buckets << 3
          );
    work.count._M_h._M_bucket_count = 0;
    work.count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((_Map_pointer)&work.count._M_h._M_rehash_policy._M_next_resize !=
        work.data.c.
        super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node) {
      operator_delete(work.data.c.
                      super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node,
                      (long)work.count._M_h._M_buckets << 3);
    }
    ppBVar52 = work.data.c.
               super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_last;
    if (auStack_2a8 != (undefined1  [8])0x0) {
      if (work.data.c.
          super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
          ._M_impl.super__Deque_impl_data._M_start._M_last <
          work.data.c.
          super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last + 1) {
        ppBVar44 = work.data.c.
                   super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last + -1;
        do {
          ppBVar1 = ppBVar44 + 1;
          ppBVar44 = ppBVar44 + 1;
          operator_delete(*ppBVar1,0x200);
        } while (ppBVar44 < ppBVar52);
      }
      operator_delete((void *)auStack_2a8,
                      (long)work.data.c.
                            super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                            ._M_impl.super__Deque_impl_data._M_map << 3);
    }
    auStack_2a8 = (undefined1  [8])((ulong)auStack_2a8 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_128,(ulong)*(uint *)(_Var51 + 0x28c),
               (bool *)auStack_2a8,(allocator_type *)local_60);
    if (*(int *)(_Var51 + 0x28c) != 0) {
      uVar39 = 0;
      do {
        TVar36 = Function::getLocalType
                           ((Function *)
                            currValues.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(Index)uVar39);
        if ((TVar36.id & 1) == 0 && 6 < TVar36.id) {
          *(ulong *)((long)local_128 + (uVar39 >> 6) * 8) =
               *(ulong *)((long)local_128 + (uVar39 >> 6) * 8) | 1L << ((byte)uVar39 & 0x3f);
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 < *(uint *)(_Var51 + 0x28c));
    }
    plVar28 = *(long **)(_Var51 + 0x140);
    local_b8 = *(long **)(_Var51 + 0x148);
    if (plVar28 != local_b8) {
      do {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)*plVar28);
        lVar30 = *plVar28;
        auStack_2a8 = (undefined1  [8])
                      ((long)&work.data.c.
                              super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                              ._M_impl.super__Deque_impl_data._M_start + 0x18);
        work.data.c.
        super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
        ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x1;
        work.data.c.
        super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
        ._M_impl.super__Deque_impl_data._M_map_size = 0;
        work.data.c.
        super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        work.data.c.
        super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first =
             (_Elt_pointer)
             CONCAT44(work.data.c.
                      super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first._4_4_,0x3f800000);
        work.data.c.
        super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
        work.data.c.
        super__Deque_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
        if ((long)currValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start - CONCAT44(local_b0._4_4_,local_b0._0_4_) >> 2
            != (ulong)*(uint *)(_Var51 + 0x28c)) {
          __assert_fail("currValues.size() == numLocals",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RedundantSetElimination.cpp"
                        ,0x175,
                        "void wasm::(anonymous namespace)::RedundantSetElimination::optimize(Function *)"
                       );
        }
        local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffff00000000);
        if (*(uint *)(_Var51 + 0x28c) != 0) {
          uVar39 = 0;
          do {
            if ((*(ulong *)((long)local_128 + (uVar39 >> 6) * 8) >> (uVar39 & 0x3f) & 1) != 0) {
              pSVar37 = &std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)auStack_2a8,
                                      (key_type *)
                                      (uVar39 * 4 + CONCAT44(local_b0._4_4_,local_b0._0_4_)))->
                         super_SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
              ;
              SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
              ::insert(pSVar37,(uint *)local_60);
            }
            uVar23 = local_60._0_4_ + 1;
            uVar39 = (ulong)uVar23;
            local_60._0_4_ = uVar23;
          } while (uVar23 < *(uint *)(_Var51 + 0x28c));
        }
        pBVar25 = *(BasicBlock **)(lVar30 + 0x30);
        pBStack_68 = *(BasicBlock **)(lVar30 + 0x38);
        if (pBVar25 != pBStack_68) {
          do {
            pp_Var8 = (__buckets_ptr)
                      (pBVar25->contents).start.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pEVar46 = (Expression *)*pp_Var8;
            local_40 = pBVar25;
            if (pEVar46->_id == '\t') {
              local_d8._0_4_ =
                   *(undefined4 *)
                    (CONCAT44(local_b0._4_4_,local_b0._0_4_) + (ulong)*(uint *)&pEVar46[1]._id * 4);
              lVar30 = *(long *)(_Var51 + 8);
              pMVar15 = *(Module **)(_Var51 + 0x128);
              pBVar38 = (key_type)pEVar46[1].type.id;
              do {
                expr = pBVar38;
                local_60 = (undefined1  [8])expr;
                ppEVar34 = Properties::getImmediateFallthroughPtr
                                     ((Expression **)local_60,(PassOptions *)(lVar30 + 0x30),pMVar15
                                      ,AllowTeeBrIf);
                _Var51 = __code;
                pBVar38 = (key_type)*ppEVar34;
              } while (pBVar38 != expr);
              IVar4 = *(Id *)&(expr->contents).start.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
              if (IVar4 == LocalGetId) {
                pBVar38 = (key_type)
                          (ulong)*(uint *)(CONCAT44(local_b0._4_4_,local_b0._0_4_) +
                                          (ulong)*(uint *)&(expr->contents).start.
                                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          * 4);
              }
              IVar21 = (Index)pBVar38;
              if (IVar4 != LocalGetId) {
                IVar21 = ValueNumbering::getValue(this_01,(Expression *)expr);
              }
              local_60._0_4_ = IVar21;
              local_6c = *(uint *)&pEVar46[1]._id;
              if (IVar21 == local_d8._0_4_) {
                this_02 = (LocalSet *)*pp_Var8;
                if ((this_02->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                    _id != LocalSetId) {
                  __assert_fail("int(_id) == int(T::SpecificId)",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                                ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
                }
                pEVar46 = this_02->value;
                bVar54 = LocalSet::isTee(this_02);
                if (bVar54) {
                  if ((pEVar46->type).id !=
                      (this_02->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                      type.id) {
                    *(undefined1 *)(_Var51 + 0x290) = 1;
                  }
                  *pp_Var8 = (__node_base_ptr)pEVar46;
                }
                else {
                  (this_02->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id
                       = DropId;
                  (this_02->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type
                  .id = 0;
                  *(Expression **)&this_02->index = pEVar46;
                  Drop::finalize((Drop *)this_02);
                }
              }
              else {
                *(Index *)(CONCAT44(local_b0._4_4_,local_b0._0_4_) + (ulong)local_6c * 4) = IVar21;
                if ((*(ulong *)((long)local_128 + (ulong)(local_6c >> 6) * 8) >>
                     ((ulong)local_6c & 0x3f) & 1) != 0) {
                  pSVar37 = &std::__detail::
                             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)auStack_2a8,(key_type *)local_d8)->
                             super_SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
                  ;
                  SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
                  ::erase(pSVar37,&local_6c);
                  pSVar37 = &std::__detail::
                             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)auStack_2a8,(key_type *)local_60)->
                             super_SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
                  ;
                  SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
                  ::insert(pSVar37,&local_6c);
                }
              }
            }
            else {
              if (pEVar46->_id != '\b') {
                pEVar46 = (Expression *)0x0;
              }
              uVar23 = *(uint *)(pEVar46 + 1);
              uVar39 = *(ulong *)((long)local_128 + (ulong)(uVar23 >> 6) * 8);
              if ((uVar39 >> ((ulong)uVar23 & 0x3f) & 1) != 0) {
                if (pEVar46->_id == LocalGetId) {
                  uVar39 = (ulong)*(uint *)(CONCAT44(local_b0._4_4_,local_b0._0_4_) +
                                           (ulong)uVar23 * 4);
                }
                IVar21 = (Index)uVar39;
                if (pEVar46->_id != LocalGetId) {
                  IVar21 = ValueNumbering::getValue(this_01,pEVar46);
                }
                local_60._0_4_ = IVar21;
                local_d8 = (undefined1  [8])
                           std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)auStack_2a8,(key_type *)local_60);
                pppEVar18 = (((BasicBlock *)local_d8)->contents).items.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                oldValue._0_1_ = pppEVar18 == (pointer)0x0;
                item = (BasicBlock *)CONCAT71(item._1_7_,(undefined1)oldValue);
                local_48._M_node = (_Rb_tree_node_base *)0x0;
                if ((bool)(undefined1)oldValue) {
                  local_50 = (pointer)0x0;
                }
                else {
                  local_48._M_node =
                       (_Base_ptr)
                       (((BasicBlock *)local_d8)->contents).items.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                }
                local_c0._M_node = (_Base_ptr)0x0;
                local_60 = local_d8;
                if (pppEVar18 == (pointer)0x0) {
                  local_c8 = (__buckets_ptr)
                             (((BasicBlock *)local_d8)->contents).start.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                }
                else {
                  local_c0._M_node =
                       (_Base_ptr)
                       &(((BasicBlock *)local_d8)->contents).end.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
                }
                while (bVar54 = SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
                                ::
                                IteratorBase<wasm::SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Rb_tree_const_iterator<unsigned_int>_>
                                ::operator==((IteratorBase<wasm::SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Rb_tree_const_iterator<unsigned_int>_>
                                              *)local_60,(Iterator *)local_d8),
                      puVar9 = currValues.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage, !bVar54) {
                  p_Var41 = local_48._M_node + 1;
                  if ((char)item != '\0') {
                    p_Var41 = (_Rb_tree_node_base *)
                              ((long)&(((Info *)local_60)->start).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                              (long)local_50 * 4);
                  }
                  IVar21 = p_Var41->_M_color;
                  TVar36 = Function::getLocalType
                                     ((Function *)
                                      currValues.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      *(Index *)(pEVar46 + 1));
                  left = Function::getLocalType((Function *)puVar9,IVar21);
                  if ((left.id != TVar36.id) &&
                     (bVar54 = wasm::Type::isSubType(left,TVar36), bVar54)) {
                    *(Index *)(pEVar46 + 1) = IVar21;
                    (pEVar46->type).id = left.id;
                    *(undefined1 *)(_Var51 + 0x290) = 1;
                  }
                  if ((char)item == '\x01') {
                    local_50 = (pointer)((long)local_50 + 1);
                  }
                  else {
                    local_48._M_node = (_Base_ptr)std::_Rb_tree_increment(local_48._M_node);
                  }
                }
              }
            }
            pBVar25 = (BasicBlock *)
                      &(local_40->contents).start.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          } while (pBVar25 != pBStack_68);
        }
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallSet<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)auStack_2a8);
        pvVar19 = (void *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
        if (pvVar19 != (void *)0x0) {
          operator_delete(pvVar19,(long)currValues.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar19);
        }
        plVar28 = plVar28 + 1;
      } while (plVar28 != local_b8);
    }
    if (local_128 != (undefined1  [8])0x0) {
      operator_delete((void *)local_128,
                      isRefinable.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ -
                      (long)local_128);
      local_128 = (undefined1  [8])0x0;
      isRefinable.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
      isRefinable.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      isRefinable.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._12_4_ = 0;
      isRefinable.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p._0_4_ = 0;
      isRefinable.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      isRefinable.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._12_4_ = 0;
    }
    if (*(char *)(_Var51 + 0x290) == '\x01') {
      ReFinalize::ReFinalize((ReFinalize *)auStack_2a8);
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
                ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
                 &work.count,(Expression **)local_130);
      auStack_2a8 = (undefined1  [8])&PTR__ReFinalize_01090960;
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_178);
      if (local_1a0 != (pointer)0x0) {
        operator_delete(local_1a0,(long)local_190 - (long)local_1a0);
      }
      Pass::~Pass((Pass *)auStack_2a8);
    }
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    numLocals = func->getNumLocals();
    if (numLocals == 0) {
      return; // nothing to do
    }

    // Create a unique value for use to mark unseen locations.
    unseenValue = valueNumbering.getUniqueValue();

    // create the CFG by walking the IR
    CFGWalker<RedundantSetElimination, Visitor<RedundantSetElimination>, Info>::
      doWalkFunction(func);
    // flow values across blocks
    flowValues(func);
    // remove redundant sets
    optimize(func);

    if (refinalize) {
      ReFinalize().walkFunctionInModule(func, this->getModule());
    }
  }